

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O1

void RPerm(Sarray *A,Sarray *B,vector<unsigned_long,_std::allocator<unsigned_long>_> *C,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *D)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  pointer pvVar4;
  int x;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  int RIndex;
  int index;
  
  index = 0;
  do {
    Theta(A,B,C,D);
    Rho(B,A);
    pvVar4 = (A->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (B->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      lVar2 = *(long *)&pvVar1[uVar5].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data;
      lVar7 = 0;
      uVar3 = uVar5;
      pvVar6 = pvVar4;
      do {
        *(undefined8 *)(lVar2 + lVar7 * 8) =
             *(undefined8 *)
              (*(long *)&pvVar6[(uVar3 / 5) * -5].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
              uVar5 * 8);
        lVar7 = lVar7 + 1;
        pvVar6 = pvVar6 + 3;
        uVar3 = uVar3 + 3;
      } while (lVar7 != 5);
      uVar5 = uVar5 + 1;
      pvVar4 = pvVar4 + 1;
    } while (uVar5 != 5);
    Chi(B,A);
    Iota(A,index);
    index = index + 1;
  } while (index != 0x18);
  return;
}

Assistant:

void RPerm(Sarray &A, Sarray& B, vector<uint64_t> &C, vector<uint64_t> &D){
    for(int RIndex = 0; RIndex < 24; RIndex++){
        Theta(A, B, C, D);
        Rho(B, A);
        Pi(A, B);
        Chi(B, A);
        Iota(A, RIndex);
    }
}